

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O2

bool __thiscall
vkt::shaderexecutor::BitCountCaseInstance::compare
          (BitCountCaseInstance *this,void **inputs,void **outputs)

{
  char cVar1;
  uint a;
  int iVar2;
  pointer pSVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  ulong uVar8;
  ulong uVar9;
  
  pSVar3 = (this->super_IntegerFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cVar1 = (&DAT_009f53e8)[(ulong)*(uint *)((long)&(pSVar3->varType).m_data + 4) * 4];
  uVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  uVar9 = 0;
  uVar8 = 0;
  if (0 < (int)uVar4) {
    uVar8 = (ulong)uVar4;
  }
  do {
    if (uVar8 == uVar9) {
LAB_007a9bf2:
      return (long)(int)uVar4 <= (long)uVar9;
    }
    a = *(uint *)((long)*inputs + uVar9 * 4);
    iVar2 = *(int *)((long)*outputs + uVar9 * 4);
    iVar5 = dePop32(a & (2 << (cVar1 - 1U & 0x1f)) - 1U);
    iVar6 = dePop32(a);
    if ((iVar2 < iVar5) || (iVar6 < iVar2)) {
      poVar7 = std::operator<<((ostream *)&(this->super_IntegerFunctionTestInstance).m_failMsg,
                               "Expected [");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar9);
      poVar7 = std::operator<<(poVar7,"] in range [");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
      poVar7 = std::operator<<(poVar7,", ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
      std::operator<<(poVar7,"]");
      goto LAB_007a9bf2;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const deUint32			countMask		= getLowBitMask(integerLength);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const int		out		= ((const int*)outputs[0])[compNdx];
			const int		minRef	= dePop32(value&countMask);
			const int		maxRef	= dePop32(value);

			if (!de::inRange(out, minRef, maxRef))
			{
				m_failMsg << "Expected [" << compNdx << "] in range [" << minRef << ", " << maxRef << "]";
				return false;
			}
		}

		return true;
	}